

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O0

void __thiscall
dlib::resizable_tensor::set_size
          (resizable_tensor *this,longlong n_,longlong k_,longlong nr_,longlong nc_)

{
  size_t sVar1;
  gpu_data *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  size_t in_R8;
  
  *(long *)(in_RDI + 8) = in_RSI;
  *(long *)(in_RDI + 0x10) = in_RDX;
  *(gpu_data **)(in_RDI + 0x18) = in_RCX;
  *(size_t *)(in_RDI + 0x20) = in_R8;
  *(size_t *)(in_RDI + 0x28) = in_RSI * in_RDX * (long)in_RCX * in_R8;
  sVar1 = gpu_data::size((gpu_data *)(in_RDI + 0x30));
  if ((long)sVar1 < *(long *)(in_RDI + 0x28)) {
    gpu_data::set_size(in_RCX,in_R8);
  }
  return;
}

Assistant:

void set_size(
            long long n_, long long k_ = 1, long long nr_ = 1, long long nc_ = 1
        )
        {
            DLIB_ASSERT( n_ >= 0 && k_ >= 0 && nr_ >= 0 && nc_ >= 0);

            m_n = n_;
            m_k = k_;
            m_nr = nr_;
            m_nc = nc_;
            m_size = n_*k_*nr_*nc_;
            if ((long long)data_instance.size() < m_size)
                data_instance.set_size(m_size);
#ifdef DLIB_USE_CUDA
            cudnn_descriptor.set_size(m_n,m_k,m_nr,m_nc);
#endif
        }